

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::from_timesamples
          (TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> *this,TimeSamples *ts)

{
  uint32_t uVar1;
  uint32_t uVar2;
  size_t sVar3;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  *pvVar4;
  const_reference pvVar5;
  vector<int,_std::allocator<int>_> *__x;
  vector<int,_std::allocator<int>_> *pv;
  Sample s;
  ulong local_40;
  size_t i;
  vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
  buf;
  TimeSamples *ts_local;
  TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> *this_local;
  
  buf.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ts;
  ::std::
  vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
  ::vector((vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
            *)&i);
  local_40 = 0;
  do {
    sVar3 = tinyusdz::value::TimeSamples::size
                      ((TimeSamples *)
                       buf.
                       super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (sVar3 <= local_40) {
      ::std::
      vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
      ::operator=(&this->_samples,
                  (vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
                   *)&i);
      this->_dirty = true;
      this_local._7_1_ = 1;
      s._36_4_ = 1;
LAB_004ba8b0:
      ::std::
      vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
      ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
                 *)&i);
      return (bool)(this_local._7_1_ & 1);
    }
    pvVar4 = tinyusdz::value::TimeSamples::get_samples
                       ((TimeSamples *)
                        buf.
                        super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pvVar5 = ::std::
             vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ::operator[](pvVar4,local_40);
    uVar1 = tinyusdz::value::Value::type_id(&pvVar5->value);
    uVar2 = tinyusdz::value::TypeTraits<std::vector<int,_std::allocator<int>_>_>::type_id();
    if (uVar1 != uVar2) {
      this_local._7_1_ = 0;
      s._36_4_ = 1;
      goto LAB_004ba8b0;
    }
    Sample::Sample((Sample *)&pv);
    pvVar4 = tinyusdz::value::TimeSamples::get_samples
                       ((TimeSamples *)
                        buf.
                        super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pvVar5 = ::std::
             vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ::operator[](pvVar4,local_40);
    pv = (vector<int,_std::allocator<int>_> *)pvVar5->t;
    pvVar4 = tinyusdz::value::TimeSamples::get_samples
                       ((TimeSamples *)
                        buf.
                        super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pvVar5 = ::std::
             vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ::operator[](pvVar4,local_40);
    s.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_1_ = pvVar5->blocked & 1;
    pvVar4 = tinyusdz::value::TimeSamples::get_samples
                       ((TimeSamples *)
                        buf.
                        super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pvVar5 = ::std::
             vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ::operator[](pvVar4,local_40);
    __x = tinyusdz::value::Value::as<std::vector<int,std::allocator<int>>>(&pvVar5->value,false);
    if (__x == (vector<int,_std::allocator<int>_> *)0x0) {
      this_local._7_1_ = 0;
    }
    else {
      ::std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)&s,__x);
      ::std::
      vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
      ::push_back((vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
                   *)&i,(value_type *)&pv);
    }
    s._37_3_ = 0;
    s._36_1_ = __x == (vector<int,_std::allocator<int>_> *)0x0;
    Sample::~Sample((Sample *)&pv);
    if (s._36_4_ != 0) goto LAB_004ba8b0;
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

bool from_timesamples(const value::TimeSamples &ts) {
    std::vector<Sample> buf;
    for (size_t i = 0; i < ts.size(); i++) {
      if (ts.get_samples()[i].value.type_id() != value::TypeTraits<T>::type_id()) {
        return false;
      }
      Sample s;
      s.t = ts.get_samples()[i].t;
      s.blocked = ts.get_samples()[i].blocked;
      if (const auto pv = ts.get_samples()[i].value.as<T>()) {
        s.value = (*pv);
      } else {
        return false;
      }

      buf.push_back(s);
    }


    _samples = std::move(buf);
    _dirty = true;

    return true;
  }